

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

bool Js::JavascriptOperators::IsObjectDetached(Var var)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *this;
  ArrayBuffer *pAVar6;
  
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_009a10bf;
    *puVar5 = 0;
  }
  bVar3 = TaggedInt::Is(var);
  if ((ulong)var >> 0x32 == 0 && !bVar3) {
    this = UnsafeVarTo<Js::RecyclableObject>(var);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_009a10bf;
      *puVar5 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_ArrayBuffer) {
        pAVar6 = VarTo<Js::ArrayBuffer>(var);
        return (pAVar6->super_ArrayBufferBase).isDetached;
      }
    }
    else {
      BVar4 = RecyclableObject::IsExternal(this);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_009a10bf:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
    }
  }
  return false;
}

Assistant:

bool JavascriptOperators::IsObjectDetached(Var var)
    {
        switch (GetTypeId(var))
        {
        case TypeIds_ArrayBuffer:
            return Js::VarTo<Js::ArrayBuffer>(var)->IsDetached();
        default:
            return false;
        }
    }